

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void e2e_concurrent_scan_test(void)

{
  time_t tVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  fdb_config fconfig;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_config in_stack_fffffffffffffbc8;
  undefined8 local_338 [31];
  undefined8 local_240 [31];
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined4 local_12c;
  undefined1 local_128;
  undefined1 local_127;
  undefined4 local_124;
  undefined1 local_11a;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  bVar5 = 0;
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  fdb_get_default_config();
  local_138 = 0x400;
  local_124 = 1;
  local_11a = 1;
  local_127 = 2;
  local_12c = 0x1e;
  local_128 = 1;
  memcpy(local_240,local_148,0xf8);
  puVar3 = local_240;
  puVar4 = (undefined8 *)&stack0xfffffffffffffbc8;
  for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  e2e_concurrent_scan_pattern(3,5,5,in_stack_fffffffffffffbc8,true);
  memcpy(local_338,local_148,0xf8);
  puVar3 = local_338;
  puVar4 = (undefined8 *)&stack0xfffffffffffffbc8;
  for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  e2e_concurrent_scan_pattern(3,5,5,in_stack_fffffffffffffbc8,false);
  memleak_end();
  if (e2e_concurrent_scan_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","TEST: e2e concurrent scan");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","TEST: e2e concurrent scan");
  }
  return;
}

Assistant:

void e2e_concurrent_scan_test() {
    TEST_INIT();
    memleak_start();

    randomize();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_mode=FDB_COMPACTION_AUTO;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.purging_interval = 30; // retain deleted docs for iteration
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq

    // test
    e2e_concurrent_scan_pattern(3, 5, 5, fconfig, true);
    // normal_commit
    e2e_concurrent_scan_pattern(3, 5, 5, fconfig, false);

    memleak_end();
    TEST_RESULT("TEST: e2e concurrent scan");
}